

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O2

int bio_inalign(opj_bio_t *bio)

{
  int iVar1;
  
  bio->ct = 0;
  iVar1 = 0;
  if ((char)bio->buf == -1) {
    iVar1 = bio_bytein(bio);
    if (iVar1 == 0) {
      bio->ct = 0;
      iVar1 = 0;
    }
    else {
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

int bio_inalign(opj_bio_t *bio) {
	bio->ct = 0;
	if ((bio->buf & 0xff) == 0xff) {
		if (bio_bytein(bio)) {
			return 1;
		}
		bio->ct = 0;
	}
	return 0;
}